

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O3

void __thiscall
pbrt::PMJ02BNSampler::PMJ02BNSampler
          (PMJ02BNSampler *this,int samplesPerPixel,int seed,Allocator alloc)

{
  pointer *ppiVar1;
  Point2<float> PVar2;
  Point2<float> *pPVar3;
  uint uVar4;
  vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_> *this_00;
  long lVar5;
  int iVar6;
  size_t sVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  size_t n;
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  vector<int,_std::allocator<int>_> nStored;
  int vb;
  value_type va;
  undefined4 extraout_var;
  
  this->samplesPerPixel = samplesPerPixel;
  this->seed = seed;
  (this->pixel).super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x0;
  iVar9 = 1 << (~LZCOUNT(samplesPerPixel) & 0x1eU);
  if (iVar9 != samplesPerPixel) {
    ppiVar1 = &nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage;
    nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_1_ = 0;
    nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)ppiVar1;
    detail::stringPrintfRecursive
              ((string *)&nStored,
               "PMJ02BNSampler results are best with power-of-4 samples per pixel (1, 4, 16, 64, ...)"
              );
    Warning((FileLoc *)0x0,
            (char *)nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
    if ((pointer *)
        nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != ppiVar1) {
      operator_delete(nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      CONCAT71(nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._1_7_,
                               nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
    }
  }
  if (0x10000 < samplesPerPixel) {
    ppiVar1 = &nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage;
    nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_1_ = 0;
    nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)ppiVar1;
    detail::stringPrintfRecursive<int_const&>
              ((string *)&nStored,"PMJ02BNSampler only supports up to %d samples per pixel",
               &nPMJ02bnSamples);
    Error((FileLoc *)0x0,
          (char *)nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start);
    if ((pointer *)
        nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != ppiVar1) {
      operator_delete(nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      CONCAT71(nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._1_7_,
                               nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
    }
  }
  iVar6 = 4 << (~LZCOUNT(samplesPerPixel) & 0x1eU);
  if (iVar9 == samplesPerPixel) {
    iVar6 = samplesPerPixel;
  }
  uVar4 = (uint)(byte)(((byte)((uint)LZCOUNT(iVar6) >> 1) ^ 0xf0) + 9);
  iVar6 = 1 << (uVar4 & 0x1f);
  this->pixelTileSize = iVar6;
  iVar10 = (iVar6 << (uVar4 & 0x1f)) * samplesPerPixel;
  iVar6 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x20,8);
  this_00 = (vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_> *)
            CONCAT44(extraout_var,iVar6);
  n = (size_t)iVar10;
  (this_00->alloc).memoryResource = alloc.memoryResource;
  this_00->nStored = 0;
  this_00->ptr = (Point2<float> *)0x0;
  this_00->nAlloc = 0;
  pstd::vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_>::
  reserve(this_00,n);
  if (iVar10 != 0) {
    sVar7 = 0;
    do {
      pPVar3 = this_00->ptr;
      pPVar3[sVar7].super_Tuple2<pbrt::Point2,_float>.x = 0.0;
      pPVar3[sVar7].super_Tuple2<pbrt::Point2,_float>.y = 0.0;
      sVar7 = sVar7 + 1;
    } while (n != sVar7);
  }
  this_00->nStored = n;
  this->pixelSamples = this_00;
  va = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&nStored,(ulong)(uint)(this->pixelTileSize * this->pixelTileSize),&va,
             (allocator_type *)&vb);
  lVar5 = 0;
  do {
    auVar11._8_8_ = 0;
    auVar11._0_8_ = (&pmj02bnSamples)[lVar5];
    auVar11 = vcvtudq2pd_avx512vl(auVar11);
    fVar12 = (float)this->pixelTileSize;
    auVar14._0_8_ = auVar11._0_8_ * 2.3283064365386963e-10;
    auVar14._8_8_ = auVar11._8_8_ * 2.3283064365386963e-10;
    auVar11 = vcvtpd2ps_avx(auVar14);
    auVar13._0_4_ = fVar12 * auVar11._0_4_;
    auVar13._4_4_ = fVar12 * auVar11._4_4_;
    auVar13._8_4_ = fVar12 * auVar11._8_4_;
    auVar13._12_4_ = fVar12 * auVar11._12_4_;
    auVar11 = vmovshdup_avx(auVar13);
    iVar6 = (int)auVar11._0_4_ * this->pixelTileSize + (int)auVar13._0_4_;
    if (nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar6] == samplesPerPixel) {
      if (iVar9 == samplesPerPixel) {
        LogFatal<char_const(&)[29]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/samplers.cpp"
                   ,0xe4,"Check failed: %s",(char (*) [29])"!IsPowerOf4(samplesPerPixel)");
      }
    }
    else {
      iVar10 = iVar6 * samplesPerPixel +
               nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start[iVar6];
      pPVar3 = this->pixelSamples->ptr;
      if (((pPVar3[iVar10].super_Tuple2<pbrt::Point2,_float>.x != 0.0) ||
          (fVar12 = pPVar3[iVar10].super_Tuple2<pbrt::Point2,_float>.y, fVar12 != 0.0)) ||
         (NAN(fVar12))) {
        LogFatal<char_const(&)[47]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/samplers.cpp"
                   ,0xe8,"Check failed: %s",
                   (char (*) [47])"(*pixelSamples)[sampleOffset] == Point2f(0, 0)");
      }
      auVar11 = vroundps_avx(auVar13,9);
      auVar11 = vsubps_avx(auVar13,auVar11);
      PVar2.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar11);
      pPVar3[iVar10].super_Tuple2<pbrt::Point2,_float> = PVar2.super_Tuple2<pbrt::Point2,_float>;
      nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [iVar6] = nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar6] + 1;
    }
    lVar5 = lVar5 + 1;
    if (lVar5 == 0x10000) {
      if ((long)nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar5 = (long)nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
        lVar8 = 0;
        do {
          va = nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start[lVar8];
          vb = samplesPerPixel;
          if (va != samplesPerPixel) {
            LogFatal<char_const(&)[11],char_const(&)[16],char_const(&)[11],int&,char_const(&)[16],int&>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/samplers.cpp"
                       ,0xee,"Check failed: %s == %s with %s = %s, %s = %s",
                       (char (*) [11])"nStored[i]",(char (*) [16])"samplesPerPixel",
                       (char (*) [11])"nStored[i]",&va,(char (*) [16])"samplesPerPixel",&vb);
          }
          lVar8 = lVar8 + 1;
        } while (lVar5 + (ulong)(lVar5 == 0) != lVar8);
      }
      operator_delete(nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      CONCAT71(nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._1_7_,
                               nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._0_1_) -
                      (long)nStored.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      return;
    }
  } while( true );
}

Assistant:

PMJ02BNSampler::PMJ02BNSampler(int samplesPerPixel, int seed, Allocator alloc)
    : samplesPerPixel(samplesPerPixel), seed(seed) {
    if (!IsPowerOf4(samplesPerPixel))
        Warning("PMJ02BNSampler results are best with power-of-4 samples per "
                "pixel (1, 4, 16, 64, ...)");
    // Get sorted pmj02bn samples for pixel samples
    if (samplesPerPixel > nPMJ02bnSamples)
        Error("PMJ02BNSampler only supports up to %d samples per pixel", nPMJ02bnSamples);
    // Compute _pixelTileSize_ for pmj02bn pixel samples and allocate _pixelSamples_
    pixelTileSize =
        1 << (Log4Int(nPMJ02bnSamples) - Log4Int(RoundUpPow4(samplesPerPixel)));
    int nPixelSamples = pixelTileSize * pixelTileSize * samplesPerPixel;
    pixelSamples = alloc.new_object<pstd::vector<Point2f>>(nPixelSamples, alloc);

    // Loop over pmj02bn samples and associate them with their pixels
    std::vector<int> nStored(pixelTileSize * pixelTileSize, 0);
    for (int i = 0; i < nPMJ02bnSamples; ++i) {
        Point2f p = GetPMJ02BNSample(0, i);
        p *= pixelTileSize;
        int pixelOffset = int(p.x) + int(p.y) * pixelTileSize;
        if (nStored[pixelOffset] == samplesPerPixel) {
            CHECK(!IsPowerOf4(samplesPerPixel));
            continue;
        }
        int sampleOffset = pixelOffset * samplesPerPixel + nStored[pixelOffset];
        CHECK((*pixelSamples)[sampleOffset] == Point2f(0, 0));
        (*pixelSamples)[sampleOffset] = Point2f(p - Floor(p));
        ++nStored[pixelOffset];
    }

    for (int i = 0; i < nStored.size(); ++i)
        CHECK_EQ(nStored[i], samplesPerPixel);
    for (int c : nStored)
        DCHECK_EQ(c, samplesPerPixel);
}